

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void errorOutput(string *errorMessage)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
  std::ostream::put(-0x10);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"============================================================",0x3c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar1 = std::__cxx11::string::compare((char *)errorMessage);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Error: You need to provide the algorithm to solve the problem (bfs, dfs or dijkstra) with the names of the input and output files."
               ,0x82);
    poVar3 = (ostream *)&std::cerr;
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(errorMessage->_M_dataplus)._M_p,
                        errorMessage->_M_string_length);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"============================================================",
             0x3c);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
  std::ostream::put(-0x10);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void errorOutput(string errorMessage) {
    cerr << endl << endl << "============================================================" << endl;
    if (errorMessage.compare("") == 0) {
        cerr <<
             "Error: You need to provide the algorithm to solve the problem (bfs, dfs or dijkstra) with the "
                     "names of the input and output files." << endl;
    } else {
        cerr << errorMessage << endl;
    }
    cerr << "============================================================" << endl << endl;
}